

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVaction INT_EVassoc_congestion_action
                   (CManager_conflict cm,EVstone stone_num,char *action_spec,void *client_data)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  _proto_action *p_Var4;
  EVSimpleHandlerFunc p_Var5;
  undefined8 in_RCX;
  CMTraceType trace_type;
  CManager in_RDX;
  uint in_ESI;
  long in_RDI;
  timespec ts;
  stone_type stone;
  int action_num;
  event_path_data evp;
  FMFormat **in_stack_00000078;
  void *in_stack_00000080;
  char *in_stack_00000088;
  int in_stack_00000094;
  CManager in_stack_00000098;
  event_path_data in_stack_ffffffffffffff98;
  FILE *in_stack_ffffffffffffffa0;
  timespec local_50;
  stone_type local_40;
  uint local_34;
  undefined8 local_30;
  uint local_4;
  
  trace_type = (CMTraceType)((ulong)in_RCX >> 0x20);
  local_30 = *(undefined8 *)(in_RDI + 0x118);
  local_40 = stone_struct(in_stack_ffffffffffffff98,0);
  if (local_40 == (stone_type)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    local_34 = local_40->proto_action_count;
    iVar1 = CMtrace_val[10];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init(in_RDX,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffffa0 = *(FILE **)(in_RDI + 0x120);
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(in_stack_ffffffffffffffa0,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_50);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_50.tv_sec,local_50.tv_nsec);
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"Adding Congestion action %d to stone %x\n",(ulong)local_34
              ,(ulong)in_ESI);
    }
    fflush(*(FILE **)(in_RDI + 0x120));
    p_Var4 = (_proto_action *)
             INT_CMrealloc(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    local_40->proto_actions = p_Var4;
    memset(local_40->proto_actions + (int)local_34,0,0x60);
    local_40->proto_actions[(int)local_34].data_state = Requires_Decoded;
    local_40->proto_actions[(int)local_34].action_type = Action_Congestion;
    p_Var5 = (EVSimpleHandlerFunc)
             install_response_handler
                       (in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080,
                        in_stack_00000078);
    local_40->proto_actions[(int)local_34].o.term.handler = p_Var5;
    local_40->proto_action_count = local_40->proto_action_count + 1;
    clear_response_cache((stone_type)0x13e3c0);
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

EVaction
INT_EVassoc_congestion_action(CManager cm, EVstone stone_num, 
			      char *action_spec, void *client_data)
{
#ifdef HAVE_COD_H
    event_path_data evp = cm->evp;
    int action_num;
    stone_type stone;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    action_num = stone->proto_action_count;
    CMtrace_out(cm, EVerbose, "Adding Congestion action %d to stone %x\n",
		action_num, stone_num);
    stone->proto_actions = realloc(stone->proto_actions, (action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[action_num], 0, sizeof(stone->proto_actions[0]));
    stone->proto_actions[action_num].data_state = Requires_Decoded;
    stone->proto_actions[action_num].action_type = Action_Congestion;
    stone->proto_actions[action_num].o.imm.mutable_response_data = 
 	install_response_handler(cm, stone_num, action_spec, client_data, 
				 &stone->proto_actions[action_num].matching_reference_formats);
    stone->proto_action_count++;
    clear_response_cache(stone);
    return action_num;
#else
    fprintf(stderr, "No code generation in FFS, action unavailable\n");
    return -1;
#endif    
}